

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mcts.cpp
# Opt level: O0

void __thiscall TestGame::do_move(TestGame *this,Move move)

{
  int in_ESI;
  int *in_RDI;
  int in_stack_00000244;
  char *in_stack_00000248;
  char *in_stack_00000250;
  
  if (*in_RDI == 1) {
    if ((in_ESI < 1) || (2 < in_ESI)) {
      MCTS::assertion_failed(in_stack_00000250,in_stack_00000248,in_stack_00000244);
    }
    if (in_ESI == 1) {
      in_RDI[1] = 0;
    }
  }
  else if (*in_RDI == 2) {
    if ((in_ESI < 1) || (5 < in_ESI)) {
      MCTS::assertion_failed(in_stack_00000250,in_stack_00000248,in_stack_00000244);
    }
    if (in_ESI == 1) {
      in_RDI[1] = 1;
    }
    else {
      in_RDI[1] = in_RDI[2];
    }
  }
  *in_RDI = 3 - *in_RDI;
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_to_move == 1) {
			attest(move >= 1 && move <= 2);

			if (move == 1) {
				winner = 0;
			}
			else {
			}
		}
		else if (player_to_move == 2) {
			attest(move >= 1 && move <= 5);

			if (move == 1) {
				winner = 1;
			}
			else {
				winner = X;
			}
		}

		player_to_move = 3 - player_to_move;
	}